

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t archive_mstring_get_utf8(archive_conflict *a,archive_mstring *aes,char **p)

{
  wchar_t wVar1;
  char *pcVar2;
  archive_string_conv *sc;
  char *pm;
  char *pcStack_38;
  
  wVar1 = aes->aes_set;
  if ((wVar1 & 2U) == 0) {
    *p = (char *)0x0;
    if ((wVar1 & 1U) == 0) {
      archive_mstring_get_mbs(a,aes,&pcStack_38);
    }
    if ((aes->aes_set & L'\x01') == L'\0') {
      return L'\0';
    }
    pcVar2 = get_current_charset(a);
    sc = get_sconv_object(a,pcVar2,"UTF-8",L'\x05');
    if (sc == (archive_string_conv *)0x0) {
      return L'\xffffffff';
    }
    pcVar2 = (aes->aes_mbs).s;
    (aes->aes_utf8).length = 0;
    wVar1 = archive_strncat_l(&aes->aes_utf8,pcVar2,(aes->aes_mbs).length,sc);
    if (a == (archive_conflict *)0x0) {
      free_sconv_object(sc);
    }
    if (wVar1 != L'\0') {
      return L'\xffffffff';
    }
    *(byte *)&aes->aes_set = (byte)aes->aes_set | 2;
  }
  *p = (aes->aes_utf8).s;
  return L'\0';
}

Assistant:

int
archive_mstring_get_utf8(struct archive *a, struct archive_mstring *aes,
  const char **p)
{
	struct archive_string_conv *sc;
	int r;

	/* If we already have a UTF8 form, return that immediately. */
	if (aes->aes_set & AES_SET_UTF8) {
		*p = aes->aes_utf8.s;
		return (0);
	}

	*p = NULL;
#if defined(_WIN32) && !defined(__CYGWIN__)
	/*
	 * On Windows, first try converting from WCS because (1) there's no
	 * guarantee that the conversion to MBS will succeed, e.g. when using
	 * CP_ACP, and (2) that's more efficient than converting to MBS, just to
	 * convert back to WCS again before finally converting to UTF-8
	 */
	if ((aes->aes_set & AES_SET_WCS) != 0) {
		sc = archive_string_conversion_to_charset(a, "UTF-8", 1);
		if (sc == NULL)
			return (-1);/* Couldn't allocate memory for sc. */
		archive_string_empty(&(aes->aes_utf8));
		r = archive_string_append_from_wcs_in_codepage(&(aes->aes_utf8),
			aes->aes_wcs.s, aes->aes_wcs.length, sc);
		if (a == NULL)
			free_sconv_object(sc);
		if (r == 0) {
			aes->aes_set |= AES_SET_UTF8;
			*p = aes->aes_utf8.s;
			return (0);/* success. */
		} else
			return (-1);/* failure. */
	}
#endif
	/* Try converting WCS to MBS first if MBS does not exist yet. */
	if ((aes->aes_set & AES_SET_MBS) == 0) {
		const char *pm; /* unused */
		archive_mstring_get_mbs(a, aes, &pm); /* ignore errors, we'll handle it later */
	}
	if (aes->aes_set & AES_SET_MBS) {
		sc = archive_string_conversion_to_charset(a, "UTF-8", 1);
		if (sc == NULL)
			return (-1);/* Couldn't allocate memory for sc. */
		r = archive_strncpy_l(&(aes->aes_utf8), aes->aes_mbs.s,
		    aes->aes_mbs.length, sc);
		if (a == NULL)
			free_sconv_object(sc);
		if (r == 0) {
			aes->aes_set |= AES_SET_UTF8;
			*p = aes->aes_utf8.s;
			return (0);/* success. */
		} else
			return (-1);/* failure. */
	}
	return (0);/* success. */
}